

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Prerequisite.hpp
# Opt level: O3

void __thiscall Prerequisite::displayCourseInfo(Prerequisite *this)

{
  int iVar1;
  ostream *poVar2;
  long *plVar3;
  char *local_40;
  long local_38;
  char local_30 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Course Name: ",0xd);
  (*(this->super_CourseComponent).super_Observer._vptr_Observer[3])(&local_40,this);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_40,local_38);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Number of Units: ",0x11)
  ;
  iVar1 = (*(this->super_CourseComponent).super_Observer._vptr_Observer[4])(this);
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Course Description: ",0x14);
  (*(this->super_CourseComponent).super_Observer._vptr_Observer[7])(&local_40,this);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_40,local_38);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return;
}

Assistant:

void displayCourseInfo() { 
                cout << "Course Name: " << getCourseName() << endl;
                cout << "Number of Units: " << getCourseUnits() << endl;
                cout << "Course Description: " << getCourseDescription() << endl;
            }